

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

xmlParserCtxtPtr xmlNewSAXParserCtxt(xmlSAXHandler *sax,void *userData)

{
  int iVar1;
  xmlParserCtxtPtr ctxt;
  
  ctxt = (xmlParserCtxtPtr)(*xmlMalloc)(0x2f0);
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    ctxt = (xmlParserCtxtPtr)0x0;
    xmlErrMemory((xmlParserCtxtPtr)0x0,"cannot allocate parser context\n");
  }
  else {
    memset(ctxt,0,0x2f0);
    iVar1 = xmlInitSAXParserCtxt(ctxt,sax,userData);
    if (iVar1 < 0) {
      xmlFreeParserCtxt(ctxt);
      ctxt = (xmlParserCtxtPtr)0x0;
    }
  }
  return ctxt;
}

Assistant:

xmlParserCtxtPtr
xmlNewSAXParserCtxt(const xmlSAXHandler *sax, void *userData)
{
    xmlParserCtxtPtr ctxt;

    ctxt = (xmlParserCtxtPtr) xmlMalloc(sizeof(xmlParserCtxt));
    if (ctxt == NULL) {
	xmlErrMemory(NULL, "cannot allocate parser context\n");
	return(NULL);
    }
    memset(ctxt, 0, sizeof(xmlParserCtxt));
    if (xmlInitSAXParserCtxt(ctxt, sax, userData) < 0) {
        xmlFreeParserCtxt(ctxt);
	return(NULL);
    }
    return(ctxt);
}